

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteTest.h
# Opt level: O2

void UnitTest::
     ExecuteTest<UnitTest::(anonymous_namespace)::DeferredTestReporterFixtureReportFailureSavesFailureDetailsHelper>
               (DeferredTestReporterFixtureReportFailureSavesFailureDetailsHelper *testObject,
               TestDetails *details)

{
  TestDetails *details_00;
  TestResults *pTVar1;
  int iVar2;
  TestDetails **ppTVar3;
  DeferredTestResultList *this;
  reference pvVar4;
  TestResults **ppTVar5;
  undefined8 *puVar6;
  pointer local_4b8;
  TestDetails local_4b0;
  SignalTranslator sig;
  
  ppTVar3 = CurrentTest::Details();
  *ppTVar3 = details;
  SignalTranslator::SignalTranslator(&sig);
  iVar2 = __sigsetjmp(SignalTranslator::s_jumpTarget,1);
  if (iVar2 == 0) {
    details_00 = &(testObject->super_DeferredTestReporterFixture).details;
    DeferredTestReporter::ReportTestStart((DeferredTestReporter *)testObject,details_00);
    DeferredTestReporter::ReportFailure((DeferredTestReporter *)testObject,details_00,"failure");
    this = DeferredTestReporter::GetResults((DeferredTestReporter *)testObject);
    pvVar4 = std::
             vector<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_>::at
                       (this,0);
    if (pvVar4->failed == false) {
      ppTVar5 = CurrentTest::Results();
      pTVar1 = *ppTVar5;
      ppTVar3 = CurrentTest::Details();
      TestDetails::TestDetails(&local_4b0,*ppTVar3,0x4f);
      TestResults::OnTestFailure(pTVar1,&local_4b0,"result.failed == true");
    }
    ppTVar5 = CurrentTest::Results();
    pTVar1 = *ppTVar5;
    local_4b8 = (testObject->super_DeferredTestReporterFixture).fileName._M_dataplus._M_p;
    ppTVar3 = CurrentTest::Details();
    TestDetails::TestDetails(&local_4b0,*ppTVar3,0x50);
    CheckEqual<char_const*,std::__cxx11::string>(pTVar1,&local_4b8,&pvVar4->failureFile,&local_4b0);
    SignalTranslator::~SignalTranslator(&sig);
    return;
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = "Unhandled system exception";
  __cxa_throw(puVar6,&char_const*::typeinfo,0);
}

Assistant:

void ExecuteTest(T& testObject, TestDetails const& details)
{
	CurrentTest::Details() = &details;

	try
	{
#ifdef UNITTEST_POSIX
		UNITTEST_THROW_SIGNALS
#endif
		testObject.RunImpl();
	}
	catch (AssertException const& e)
	{
		CurrentTest::Results()->OnTestFailure(
			TestDetails(details.testName, details.suiteName, e.Filename(), e.LineNumber()), e.what());
	}
	catch (std::exception const& e)
	{
		MemoryOutStream stream;
		stream << "Unhandled exception: " << e.what();
		CurrentTest::Results()->OnTestFailure(details, stream.GetText());
	}
	catch (...)
	{
		CurrentTest::Results()->OnTestFailure(details, "Unhandled exception: Crash!");
	}
}